

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O0

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateScaledTermination_Test::
OsqpTest_GetAndUpdateScaledTermination_Test(OsqpTest_GetAndUpdateScaledTermination_Test *this)

{
  OsqpTest_GetAndUpdateScaledTermination_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__OsqpTest_GetAndUpdateScaledTermination_Test_0031f2c8;
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateScaledTermination) {
  OsqpSettings settings;
  settings.scaled_termination = true;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto scaled_termination = solver.GetScaledTermination();
    ASSERT_TRUE(scaled_termination.ok());
    EXPECT_TRUE(*scaled_termination);
  }

  ASSERT_TRUE(solver.UpdateScaledTermination(false).ok());
  {
    const auto scaled_termination = solver.GetScaledTermination();
    ASSERT_TRUE(scaled_termination.ok());
    EXPECT_FALSE(*scaled_termination);
  }
}